

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,section_content *c)

{
  ostream *poVar1;
  undefined1 local_a8 [16];
  ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_> local_98;
  external_fixup *local_88;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_80;
  undefined1 local_78 [16];
  ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_> local_68;
  internal_fixup *local_58;
  __normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
  local_50;
  undefined1 local_48 [16];
  ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> local_38;
  ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> *local_28;
  pointer_based_iterator<const_unsigned_char> local_20;
  section_content *local_18;
  section_content *c_local;
  ostream *os_local;
  
  local_18 = c;
  c_local = (section_content *)os;
  poVar1 = std::operator<<(os,"{ kind:");
  poVar1 = operator<<(poVar1,local_18->kind);
  poVar1 = std::operator<<(poVar1,", align:");
  poVar1 = std::operator<<(poVar1,local_18->align);
  std::operator<<(poVar1,", data:[");
  local_20.pos_ = (pointer)std::begin<pstore::small_vector<unsigned_char,128ul>>(&local_18->data);
  local_28 = (ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> *)
             std::end<pstore::small_vector<unsigned_char,128ul>>(&local_18->data);
  std::ostream_iterator<unsigned_int,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_38,(ostream_type *)c_local,", ");
  std::
  copy<pstore::pointer_based_iterator<unsigned_char_const>,std::ostream_iterator<unsigned_int,char,std::char_traits<char>>>
            ((pointer_based_iterator<const_unsigned_char>)local_48,local_20,local_28);
  std::operator<<((ostream *)c_local,"], ifixups:[");
  local_50._M_current =
       (internal_fixup *)
       std::
       begin<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
                 (&local_18->ifixups);
  local_58 = (internal_fixup *)
             std::
             end<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
                       (&local_18->ifixups);
  std::ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_>::
  ostream_iterator(&local_68,(ostream_type *)c_local,", ");
  std::
  copy<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,std::ostream_iterator<pstore::repo::internal_fixup,char,std::char_traits<char>>>
            ((internal_fixup *)local_78,local_50,
             (ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_> *)
             local_58);
  std::operator<<((ostream *)c_local,"], xfixups:[");
  local_80._M_current =
       (external_fixup *)
       std::
       begin<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                 (&local_18->xfixups);
  local_88 = (external_fixup *)
             std::
             end<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                       (&local_18->xfixups);
  std::ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_>::
  ostream_iterator(&local_98,(ostream_type *)c_local,", ");
  std::
  copy<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,std::ostream_iterator<pstore::repo::external_fixup,char,std::char_traits<char>>>
            ((external_fixup *)local_a8,local_80,
             (ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_> *)
             local_88);
  return (ostream *)c_local;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_content const & c) {
            os << "{ kind:" << c.kind << ", align:" << c.align << ", data:[";
            std::copy (std::begin (c.data), std::end (c.data),
                       std::ostream_iterator<unsigned> (os, ", "));
            os << "], ifixups:[";
            std::copy (std::begin (c.ifixups), std::end (c.ifixups),
                       std::ostream_iterator<internal_fixup> (os, ", "));
            os << "], xfixups:[";
            std::copy (std::begin (c.xfixups), std::end (c.xfixups),
                       std::ostream_iterator<external_fixup> (os, ", "));
            return os;
        }